

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_json_parser.cpp
# Opt level: O0

void parse_dark_region_from_json(RandomizerWorld *world,Json *json)

{
  string *this;
  bool bVar1;
  const_reference this_00;
  LandstalkerException *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  WorldRegion *local_80;
  WorldRegion *region;
  allocator<char> local_61;
  key_type local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *dark_region_name;
  Json *json_local;
  RandomizerWorld *world_local;
  
  dark_region_name = (string *)json;
  json_local = (Json *)world;
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[11],_0>(json,(char (*) [11])"darkRegion");
  this = dark_region_name;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"darkRegion",&local_61);
    this_00 = nlohmann::
              basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::at((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)this,&local_60);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_40,this_00);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    local_20 = &local_40;
    local_80 = RandomizerWorld::region((RandomizerWorld *)json_local,local_20);
    if (local_80 == (WorldRegion *)0x0) {
      this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_c0,"Dark region \'",local_20);
      std::operator+(&local_a0,&local_c0,"\' could not be found");
      LandstalkerException::LandstalkerException(this_01,&local_a0);
      __cxa_throw(this_01,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    RandomizerWorld::dark_region((RandomizerWorld *)json_local,local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

static void parse_dark_region_from_json(RandomizerWorld& world, const Json& json)
{
    if(json.contains("darkRegion"))
    {
        const std::string& dark_region_name = json.at("darkRegion");

        WorldRegion* region = world.region(dark_region_name);
        if(!region)
            throw LandstalkerException("Dark region '" + dark_region_name + "' could not be found");
        world.dark_region(region);
    }
}